

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O2

void __thiscall HighVariable::printInfo(HighVariable *this,ostream *s)

{
  Varnode *this_00;
  ostream *poVar1;
  pointer ppVVar2;
  
  updateType(this);
  if (this->symbol == (Symbol *)0x0) {
    poVar1 = std::operator<<(s,"Variable: UNNAMED");
  }
  else {
    poVar1 = std::operator<<(s,"Variable: ");
    std::operator<<(poVar1,(string *)&this->symbol->name);
    poVar1 = s;
    if (this->symboloffset != -1) {
      std::operator<<(s,"(partial)");
    }
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(s,"Type: ");
  (*this->type->_vptr_Datatype[3])(this->type,s);
  std::operator<<(s,"\n\n");
  for (ppVVar2 = (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar2 !=
      (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
    this_00 = *ppVVar2;
    *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
         *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(s,this_00->mergegroup);
    std::operator<<(poVar1,": ");
    Varnode::printInfo(this_00,s);
  }
  return;
}

Assistant:

void HighVariable::printInfo(ostream &s) const

{
  vector<Varnode *>::const_iterator viter;
  Varnode *vn;

  updateType();
  if (symbol == (Symbol *)0) {
    s << "Variable: UNNAMED" << endl;
  }
  else {
    s << "Variable: " << symbol->getName();
    if (symboloffset!=-1)
      s << "(partial)";
    s << endl;
  }
  s << "Type: ";
  type->printRaw(s);
  s << "\n\n";
				
  for(viter=inst.begin();viter!=inst.end();++viter) {
    vn = *viter;
    s << dec << vn->getMergeGroup() << ": ";
    vn->printInfo(s);
  }
}